

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_test.cc
# Opt level: O3

int main(void)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  
  puVar1 = (undefined8 *)operator_new(0x10);
  *puVar1 = &PTR___cxa_pure_virtual_00103d90;
  puVar2 = (undefined4 *)operator_new(4);
  puVar1[1] = puVar2;
  *puVar1 = &PTR_setLevel_00103d50;
  *puVar2 = 10;
  puVar1 = (undefined8 *)operator_new(0x10);
  *puVar1 = &PTR___cxa_pure_virtual_00103d90;
  puVar2 = (undefined4 *)operator_new(4);
  puVar1[1] = puVar2;
  *puVar1 = &PTR_setLevel_00103da8;
  *puVar2 = 100;
  return 0;
}

Assistant:

int main() {
  Director* director = new Director(new SimpleBuilder);
  Maze* maze = director->getMaze();
  assert(maze->level == 10);

  director = new Director(new ComplexBuilder);
  maze = director->getMaze();
  assert(maze->level == 100);
}